

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * __thiscall
testing::internal::FormatEpochTimeInMillisAsRFC3339_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,TimeInMillis ms)

{
  bool bVar1;
  int value;
  int value_00;
  int value_01;
  int value_02;
  int value_03;
  tm time_struct;
  int local_26c;
  tm local_268;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar1 = PortableLocaltime((long)this / 1000,&local_268);
  if (bVar1) {
    local_26c = local_268.tm_year + 0x76c;
    StreamableToString<int>(&local_1d0,&local_26c);
    std::operator+(&local_1b0,&local_1d0,"-");
    String::FormatIntWidth2_abi_cxx11_(&local_1f0,(String *)(ulong)(local_268.tm_mon + 1),value);
    std::operator+(&local_190,&local_1b0,&local_1f0);
    std::operator+(&local_170,&local_190,"-");
    String::FormatIntWidth2_abi_cxx11_(&local_210,(String *)(ulong)(uint)local_268.tm_mday,value_00)
    ;
    std::operator+(&local_150,&local_170,&local_210);
    std::operator+(&local_130,&local_150,"T");
    String::FormatIntWidth2_abi_cxx11_(&local_230,(String *)(ulong)(uint)local_268.tm_hour,value_01)
    ;
    std::operator+(&local_110,&local_130,&local_230);
    std::operator+(&local_f0,&local_110,":");
    String::FormatIntWidth2_abi_cxx11_(&local_90,(String *)(ulong)(uint)local_268.tm_min,value_02);
    std::operator+(&local_70,&local_f0,&local_90);
    std::operator+(&local_50,&local_70,":");
    String::FormatIntWidth2_abi_cxx11_(&local_b0,(String *)(ulong)(uint)local_268.tm_sec,value_03);
    std::operator+(&local_d0,&local_50,&local_b0);
    std::operator+(__return_storage_ptr__,&local_d0,"Z");
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_d0);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string FormatEpochTimeInMillisAsRFC3339(TimeInMillis ms) {
  struct tm time_struct;
  if (!PortableLocaltime(static_cast<time_t>(ms / 1000), &time_struct))
    return "";
  // YYYY-MM-DDThh:mm:ss
  return StreamableToString(time_struct.tm_year + 1900) + "-" +
      String::FormatIntWidth2(time_struct.tm_mon + 1) + "-" +
      String::FormatIntWidth2(time_struct.tm_mday) + "T" +
      String::FormatIntWidth2(time_struct.tm_hour) + ":" +
      String::FormatIntWidth2(time_struct.tm_min) + ":" +
      String::FormatIntWidth2(time_struct.tm_sec) + "Z";
}